

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O3

Vec_Int_t * Lms_GiaCountTruths(Lms_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int *__s;
  long lVar7;
  
  iVar1 = p->vTtMem->nEntries;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  pVVar6->nCap = iVar5;
  if (iVar5 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar5 << 2);
  }
  pVVar6->pArray = __s;
  pVVar6->nSize = iVar1;
  memset(__s,0,(long)iVar1 << 2);
  pVVar3 = p->vTruthIds;
  iVar5 = pVVar3->nSize;
  if (0 < iVar5) {
    piVar4 = pVVar3->pArray;
    lVar7 = 0;
    do {
      iVar2 = piVar4[lVar7];
      if (-1 < (long)iVar2) {
        if (iVar1 <= iVar2) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        __s[iVar2] = __s[iVar2] + 1;
        iVar5 = pVVar3->nSize;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar5);
  }
  return pVVar6;
}

Assistant:

Vec_Int_t * Lms_GiaCountTruths( Lms_Man_t * p )
{
    Vec_Int_t * vCounts = Vec_IntStart( Vec_MemEntryNum(p->vTtMem) );
    int i, Entry;
    Vec_IntForEachEntry( p->vTruthIds, Entry, i )
        if ( Entry >= 0 )
            Vec_IntAddToEntry( vCounts, Entry, 1 );
    return vCounts;
}